

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void anon_unknown.dwarf_b4dde::writeTimestamp(uint8_t *buffer,time_t time)

{
  tm *ptVar1;
  tm *ptVar2;
  time_t tVar3;
  time_t tVar4;
  int16_t timeZone;
  time_t gt;
  time_t lt;
  tm *parts;
  uint16_t *buff16;
  time_t time_local;
  uint8_t *buffer_local;
  
  buff16 = (uint16_t *)time;
  time_local = (time_t)buffer;
  ptVar1 = localtime((time_t *)&buff16);
  ptVar2 = localtime((time_t *)&buff16);
  tVar3 = mktime(ptVar2);
  ptVar2 = gmtime((time_t *)&buff16);
  tVar4 = mktime(ptVar2);
  *(ushort *)buffer = ((ushort)((tVar3 - tVar4) / 0x3c) & 0xfff) + 0x1000;
  *(short *)(buffer + 2) = (short)ptVar1->tm_year + 0x76c;
  *(char *)(time_local + 4) = (char)ptVar1->tm_mon + '\x01';
  *(char *)(time_local + 5) = (char)ptVar1->tm_mday;
  *(char *)(time_local + 6) = (char)ptVar1->tm_hour;
  *(char *)(time_local + 7) = (char)ptVar1->tm_min;
  *(char *)(time_local + 8) = (char)ptVar1->tm_sec;
  *(undefined1 *)(time_local + 9) = 0;
  *(undefined1 *)(time_local + 10) = 0;
  *(undefined1 *)(time_local + 0xb) = 0;
  return;
}

Assistant:

void writeTimestamp(uint8_t *buffer, const time_t time)
{
    const auto buff16 = reinterpret_cast<uint16_t *>(buffer);

    const tm *parts = localtime(&time);

    const time_t lt = mktime(localtime(&time));
    const time_t gt = mktime(gmtime(&time));
    const auto timeZone = static_cast<int16_t>((lt - gt) / 60);

    buff16[0] = (1 << 12) + (timeZone & 0x0fff);
    buff16[1] = static_cast<int16_t>(parts->tm_year + 1900);
    buffer[4] = static_cast<uint8_t>(parts->tm_mon + 1);
    buffer[5] = static_cast<uint8_t>(parts->tm_mday);
    buffer[6] = static_cast<uint8_t>(parts->tm_hour);
    buffer[7] = static_cast<uint8_t>(parts->tm_min);
    buffer[8] = static_cast<uint8_t>(parts->tm_sec);
    buffer[9] = 0;  // ms parts
    buffer[10] = 0;
    buffer[11] = 0;
}